

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.cpp
# Opt level: O3

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall
duckdb::ArrowTableFunction::ArrowScanInitGlobal
          (ArrowTableFunction *this,ClientContext *context,TableFunctionInitInput *input)

{
  ArrowScanFunctionData *function;
  _Head_base<0UL,_duckdb::ArrowArrayStreamWrapper_*,_false> _Var1;
  size_type *psVar2;
  _Head_base<0UL,_duckdb::ArrowArrayStreamWrapper_*,_false> _Var3;
  pointer pAVar4;
  DatabaseInstance *this_00;
  idx_t iVar5;
  const_reference __x;
  pointer *__ptr;
  unsigned_long *col_idx;
  size_type *psVar6;
  _Head_base<0UL,_duckdb::ArrowScanGlobalState_*,_false> local_48;
  _Head_base<0UL,_duckdb::ArrowArrayStreamWrapper_*,_false> local_40;
  __uniq_ptr_impl<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  local_38;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&input->bind_data);
  function = (ArrowScanFunctionData *)(input->bind_data).ptr;
  local_48._M_head_impl = (ArrowScanGlobalState *)operator_new(0x80);
  (local_48._M_head_impl)->batch_index = 0;
  *(undefined8 *)&(local_48._M_head_impl)->done = 0;
  ((local_48._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__ArrowScanGlobalState_02453988;
  ((local_48._M_head_impl)->stream).
  super_unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ArrowArrayStreamWrapper_*,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
  .super__Head_base<0UL,_duckdb::ArrowArrayStreamWrapper_*,_false> =
       (_Head_base<0UL,_duckdb::ArrowArrayStreamWrapper_*,_false>)0x0;
  ((local_48._M_head_impl)->main_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&((local_48._M_head_impl)->main_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&((local_48._M_head_impl)->main_mutex).super___mutex_base._M_mutex + 0x10) =
       0;
  ((local_48._M_head_impl)->main_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  ((local_48._M_head_impl)->main_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (local_48._M_head_impl)->max_threads = 1;
  ((local_48._M_head_impl)->projection_ids).
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ((local_48._M_head_impl)->projection_ids).
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ((local_48._M_head_impl)->projection_ids).
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ((local_48._M_head_impl)->scanned_types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_48._M_head_impl)->scanned_types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_48._M_head_impl)->scanned_types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ProduceArrowScan((duckdb *)&local_40,function,&input->column_ids,(input->filters).ptr);
  pAVar4 = unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
                         *)&local_48);
  _Var3._M_head_impl = local_40._M_head_impl;
  local_40._M_head_impl = (ArrowArrayStreamWrapper *)0x0;
  _Var1._M_head_impl =
       (pAVar4->stream).
       super_unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ArrowArrayStreamWrapper_*,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
       .super__Head_base<0UL,_duckdb::ArrowArrayStreamWrapper_*,_false>._M_head_impl;
  (pAVar4->stream).
  super_unique_ptr<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ArrowArrayStreamWrapper,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ArrowArrayStreamWrapper_*,_std::default_delete<duckdb::ArrowArrayStreamWrapper>_>
  .super__Head_base<0UL,_duckdb::ArrowArrayStreamWrapper_*,_false>._M_head_impl = _Var3._M_head_impl
  ;
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
  .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       (tuple<duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
        )(tuple<duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )this;
  if (_Var1._M_head_impl != (ArrowArrayStreamWrapper *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_ArrowArrayStreamWrapper + 0x10))();
    if (local_40._M_head_impl != (ArrowArrayStreamWrapper *)0x0) {
      (**(code **)(*(long *)local_40._M_head_impl + 0x10))();
    }
  }
  this_00 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&context->db);
  iVar5 = DatabaseInstance::NumberOfThreads(this_00);
  pAVar4 = unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
                         *)&local_48);
  pAVar4->max_threads = iVar5;
  if ((input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pAVar4 = unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
             ::operator->((unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
                           *)&local_48);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pAVar4->projection_ids,
               &(input->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>)
    ;
    psVar6 = (input->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    psVar2 = (input->column_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (psVar6 != psVar2) {
      do {
        if (*psVar6 == 0xffffffffffffffff) {
          pAVar4 = unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
                   ::operator->((unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
                                 *)&local_48);
          ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
          emplace_back<duckdb::LogicalTypeId_const&>
                    ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)
                     &pAVar4->scanned_types,&LogicalType::ROW_TYPE);
        }
        else {
          pAVar4 = unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
                   ::operator->((unique_ptr<duckdb::ArrowScanGlobalState,_std::default_delete<duckdb::ArrowScanGlobalState>,_true>
                                 *)&local_48);
          __x = vector<duckdb::LogicalType,_true>::operator[](&function->all_types,*psVar6);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                     &pAVar4->scanned_types,__x);
        }
        psVar6 = psVar6 + 1;
      } while (psVar6 != psVar2);
    }
  }
  *(ArrowScanGlobalState **)
   local_38._M_t.
   super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
   .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl =
       local_48._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(_Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )local_38._M_t.
             super__Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
             .super__Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<GlobalTableFunctionState> ArrowTableFunction::ArrowScanInitGlobal(ClientContext &context,
                                                                             TableFunctionInitInput &input) {
	auto &bind_data = input.bind_data->Cast<ArrowScanFunctionData>();
	auto result = make_uniq<ArrowScanGlobalState>();
	result->stream = ProduceArrowScan(bind_data, input.column_ids, input.filters.get());
	result->max_threads = ArrowScanMaxThreads(context, input.bind_data.get());
	if (!input.projection_ids.empty()) {
		result->projection_ids = input.projection_ids;
		for (const auto &col_idx : input.column_ids) {
			if (col_idx == COLUMN_IDENTIFIER_ROW_ID) {
				result->scanned_types.emplace_back(LogicalType::ROW_TYPE);
			} else {
				result->scanned_types.push_back(bind_data.all_types[col_idx]);
			}
		}
	}
	return std::move(result);
}